

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example2.cpp
# Opt level: O1

void Create_Pop_Up_Dialog(void)

{
  Am_Slot_Key AVar1;
  ushort uVar2;
  ushort uVar3;
  Am_Wrapper *pAVar4;
  undefined8 uVar5;
  Am_Value_List *pAVar6;
  Am_Object *pAVar7;
  Am_Object AVar8;
  Am_Object AStack_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Value_List local_40 [16];
  Am_Value_List local_30 [16];
  
  Am_Object::Create((char *)&local_48);
  uVar2 = Am_Object::Set((ushort)&local_48,true,0);
  uVar2 = Am_Object::Set(uVar2,100,100);
  uVar2 = Am_Object::Set(uVar2,0x65,100);
  uVar2 = Am_Object::Set(uVar2,0x66,0x113);
  uVar2 = Am_Object::Set(uVar2,0x67,100);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Motif_Light_Blue);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  uVar2 = Am_Object::Set(uVar2,(Am_Method_Wrapper *)0x89,_Am_Default_Pop_Up_Window_Destroy_Method);
  AVar1 = MY_WIDGET;
  Am_Object::Create((char *)&local_58);
  uVar3 = Am_Object::Set((ushort)&local_58,100,0x14);
  uVar3 = Am_Object::Set(uVar3,0x65,0x14);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Motif_Light_Blue);
  uVar3 = Am_Object::Set(uVar3,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  Am_Value_List::Am_Value_List(local_30);
  uVar5 = Am_Value_List::Add(local_30,"Hamburger",1,1);
  uVar5 = Am_Value_List::Add(uVar5,"Hot dog",1,1);
  pAVar6 = (Am_Value_List *)Am_Value_List::Add(uVar5,"Chicken Nuggets",1,1);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar6);
  uVar3 = Am_Object::Set(uVar3,(Am_Wrapper *)0xa2,(ulong)pAVar4);
  pAVar7 = (Am_Object *)Am_Object::Set(uVar3,(char *)0x169,0x10603e);
  Am_Object::Am_Object(&local_50,pAVar7);
  AVar8.data._2_6_ = 0;
  AVar8.data._0_2_ = AVar1;
  AVar8.data = (Am_Object_Data *)Am_Object::Add_Part(uVar2,AVar8,(ulong)&local_50);
  Am_Object::Create((char *)&local_68);
  uVar2 = Am_Object::Set((ushort)&local_68,100,0xaf);
  uVar2 = Am_Object::Set(uVar2,0x65,10);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Motif_Light_Blue);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  Am_Value_List::Am_Value_List(local_40);
  Am_Object::Create((char *)&local_70);
  uVar3 = Am_Object::Set((ushort)&local_70,(char *)0x150,0x10606d);
  pAVar7 = (Am_Object *)
           Am_Object::Set(uVar3,(Am_Method_Wrapper *)0xca,(ulong)ok_method.from_wrapper);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar7);
  uVar5 = Am_Value_List::Add(local_40,pAVar4,1,1);
  Am_Object::Create((char *)&AStack_78);
  uVar3 = Am_Object::Set((ushort)&AStack_78,(char *)0x150,0x106070);
  pAVar7 = (Am_Object *)
           Am_Object::Set(uVar3,(Am_Method_Wrapper *)0xca,(ulong)cancel_method.from_wrapper);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar7);
  pAVar6 = (Am_Value_List *)Am_Value_List::Add(uVar5,pAVar4,1,1);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar6);
  pAVar7 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0xa2,(ulong)pAVar4);
  Am_Object::Am_Object(&local_60,pAVar7);
  pAVar7 = (Am_Object *)Am_Object::Add_Part(AVar8,SUB81(&local_60,0),1);
  Am_Object::operator=(&pop_up_window,pAVar7);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&AStack_78);
  Am_Object::~Am_Object(&local_70);
  Am_Value_List::~Am_Value_List(local_40);
  Am_Object::~Am_Object(&local_68);
  Am_Object::~Am_Object(&local_50);
  Am_Value_List::~Am_Value_List(local_30);
  Am_Object::~Am_Object(&local_58);
  Am_Object::~Am_Object(&local_48);
  return;
}

Assistant:

void Create_Pop_Up_Dialog() {
  pop_up_window = Am_Window.Create("pop up window")
    .Set (Am_VISIBLE, false) //start off window as invisible
    .Set (Am_LEFT, 100)
    .Set (Am_TOP, 100)
    .Set (Am_WIDTH, 275)
    .Set (Am_HEIGHT, 100)
    .Set (Am_FILL_STYLE, Am_Motif_Light_Blue)
    // the Am_DESTROY_WINDOW_METHOD is called if the user closes the
    // window using the close box.  The default method Destroys the
    // window, which we don't want to do.  Instead, use popup window handler,
    // which does Cancel.
    .Set (Am_DESTROY_WINDOW_METHOD, Am_Default_Pop_Up_Window_Destroy_Method)
    .Add_Part(MY_WIDGET, Am_Radio_Button_Panel.Create()
	      .Set(Am_LEFT, 20)
	      .Set(Am_TOP, 20)
	      .Set (Am_FILL_STYLE, Am_Motif_Light_Blue)
	      .Set (Am_ITEMS, Am_Value_List()
		    .Add("Hamburger")
		    .Add("Hot dog")
		    .Add("Chicken Nuggets")
		    )
	      .Set(Am_VALUE, "Hamburger") //initial value for widget
	      )
    .Add_Part(Am_Button_Panel.Create("ok-cancel")
	      //use a built-in formula for left that will make be
	      //centered in window
	      .Set(Am_LEFT, 175)
	      .Set(Am_TOP, 10)
	      .Set(Am_FILL_STYLE, Am_Motif_Light_Blue)
	      .Set(Am_ITEMS, Am_Value_List()
		   //the default Am_Standard_OK_Command just returns
		   //true, but our custom ok_method will return the
		   //correct value.
		   .Add(Am_Command.Create("ok")
			.Set(Am_LABEL, "OK")
			.Set(Am_DO_METHOD, ok_method))
		   .Add(Am_Command.Create("cancel")
			.Set(Am_LABEL, "CANCEL")
			.Set(Am_DO_METHOD, cancel_method))
		   )
	      )
    ;
}